

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O3

void tommy_hashlin_init(tommy_hashlin *hashlin)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  tommy_hashlin_node **pptVar4;
  long lVar5;
  long in_FS_OFFSET;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hashlin->bucket_bit = 6;
  hashlin->bucket_max = 0x40;
  hashlin->bucket_mask = 0x3f;
  pptVar4 = (tommy_hashlin_node **)lrtr_calloc(0x40,8);
  hashlin->bucket[0] = pptVar4;
  auVar3 = _DAT_00117c70;
  auVar2 = _DAT_00117c60;
  lVar5 = 0;
  iVar6 = (int)DAT_00117c80;
  iVar7 = DAT_00117c80._4_4_;
  do {
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8 = (auVar8 | auVar2) ^ auVar3;
    if (auVar8._4_4_ == iVar7 && auVar8._0_4_ < iVar6) {
      hashlin->bucket[lVar5 + 1] = pptVar4;
      hashlin->bucket[lVar5 + 2] = pptVar4;
    }
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  hashlin->state = 0;
  hashlin->low_max = hashlin->bucket_max;
  hashlin->low_mask = hashlin->bucket_mask;
  hashlin->split = 0;
  hashlin->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_hashlin_init(tommy_hashlin* hashlin)
{
	tommy_uint_t i;

	/* fixed initial size */
	hashlin->bucket_bit = TOMMY_HASHLIN_BIT;
	hashlin->bucket_max = 1 << hashlin->bucket_bit;
	hashlin->bucket_mask = hashlin->bucket_max - 1;
	hashlin->bucket[0] = tommy_cast(tommy_hashlin_node**, tommy_calloc(hashlin->bucket_max, sizeof(tommy_hashlin_node*)));
	for (i = 1; i < TOMMY_HASHLIN_BIT; ++i)
		hashlin->bucket[i] = hashlin->bucket[0];

	/* stable state */
	tommy_hashlin_stable(hashlin);

	hashlin->count = 0;
}